

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMDocumentImpl::setDocumentURI(DOMDocumentImpl *this)

{
  XMLCh *in_RSI;
  
  setDocumentURI((DOMDocumentImpl *)&this[-1].fChanges,in_RSI);
  return;
}

Assistant:

void DOMDocumentImpl::setDocumentURI(const XMLCh* documentURI){
    if (documentURI && *documentURI) {
        XMLCh* temp = (XMLCh*) this->allocate((XMLString::stringLen(documentURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(documentURI, temp);
        fDocumentURI = temp;
    }
    else
        fDocumentURI = 0;
}